

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.cpp
# Opt level: O2

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseUnary(Parser *this)

{
  Token *this_00;
  Position *__args_1;
  undefined1 auVar1 [8];
  bool bVar2;
  mapped_type *pmVar3;
  const_iterator cVar4;
  long *in_RSI;
  TokenType type;
  Lexer *local_58;
  undefined1 local_50 [8];
  Token *tok;
  TokenType local_40 [12];
  
  this_00 = *(Token **)(*in_RSI + 0xb8);
  tok = this_00;
  bVar2 = Token::operator==(this_00,TOK_OP_BRACKET_OPEN);
  if (bVar2) {
    parseBrackets(this);
    return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
           (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
  }
  bVar2 = Token::operator==(this_00,TOK_OP_ARR_BRACKET_OPEN);
  if (bVar2) {
    parseArray(this);
    return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
           (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
  }
  type = this_00->type;
  local_40[0] = type;
  pmVar3 = std::__detail::
           _Map_base<pfederc::TokenType,_std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>,_std::allocator<std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>_>,_std::__detail::_Select1st,_std::equal_to<pfederc::TokenType>,_std::hash<pfederc::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<pfederc::TokenType,_std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>,_std::allocator<std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>_>,_std::__detail::_Select1st,_std::equal_to<pfederc::TokenType>,_std::hash<pfederc::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)OPERATORS_INFO,local_40);
  if ((pmVar3->super__Tuple_impl<0UL,_unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>)
      .super__Tuple_impl<1UL,_pfederc::OperatorType,_pfederc::Associativity>.
      super__Head_base<1UL,_pfederc::OperatorType,_false>._M_head_impl == BINARY) {
    local_40[0] = this_00->type;
    cVar4 = std::
            _Hashtable<pfederc::TokenType,_std::pair<const_pfederc::TokenType,_pfederc::TokenType>,_std::allocator<std::pair<const_pfederc::TokenType,_pfederc::TokenType>_>,_std::__detail::_Select1st,_std::equal_to<pfederc::TokenType>,_std::hash<pfederc::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<pfederc::TokenType,_std::pair<const_pfederc::TokenType,_pfederc::TokenType>,_std::allocator<std::pair<const_pfederc::TokenType,_pfederc::TokenType>_>,_std::__detail::_Select1st,_std::equal_to<pfederc::TokenType>,_std::hash<pfederc::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)TOKEN_BIOP_TO_UNOP,local_40);
    if (cVar4.
        super__Node_iterator_base<std::pair<const_pfederc::TokenType,_pfederc::TokenType>,_false>.
        _M_cur == (__node_type *)0x0) goto LAB_0010c523;
    type = *(TokenType *)
            ((long)cVar4.
                   super__Node_iterator_base<std::pair<const_pfederc::TokenType,_pfederc::TokenType>,_false>
                   ._M_cur + 10);
  }
  do {
    Lexer::next((Lexer *)*in_RSI);
    bVar2 = Token::operator==(*(Token **)(*in_RSI + 0xb8),TOK_EOL);
  } while (bVar2);
  std::__detail::
  _Map_base<pfederc::TokenType,_std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>,_std::allocator<std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>_>,_std::__detail::_Select1st,_std::equal_to<pfederc::TokenType>,_std::hash<pfederc::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  ::at((_Map_base<pfederc::TokenType,_std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>,_std::allocator<std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>_>,_std::__detail::_Select1st,_std::equal_to<pfederc::TokenType>,_std::hash<pfederc::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
        *)OPERATORS_INFO,&type);
  parseExpression((Parser *)&local_58,(Precedence)in_RSI);
  if (local_58 != (Lexer *)0x0) {
    __args_1 = (Position *)*in_RSI;
    Position::operator+(&this_00->pos,(Position *)&(local_58->filePath)._M_string_length);
    std::
    make_unique<pfederc::UnOpExpr,pfederc::Lexer&,pfederc::Position,pfederc::Token_const*&,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>
              ((Lexer *)local_50,__args_1,(Token **)local_40,
               (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&tok);
    auVar1 = local_50;
    local_50 = (undefined1  [8])0x0;
    this->lexer = (Lexer *)auVar1;
    std::unique_ptr<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_> *)local_50);
    if (local_58 == (Lexer *)0x0) {
      return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
             (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
    }
    (*local_58->_vptr_Lexer[1])();
    return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
           (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
  }
LAB_0010c523:
  this->lexer = (Lexer *)0x0;
  return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseUnary() noexcept {
  const Token *tok = lexer.getCurrentToken();
  if (*tok == TokenType::TOK_OP_BRACKET_OPEN)
    return parseBrackets();
  else if (*tok == TokenType::TOK_OP_ARR_BRACKET_OPEN)
    return parseArray();

  
  TokenType type = tok->getType();
  if (std::get<1>(OPERATORS_INFO.at(tok->getType())) == OperatorType::BINARY) {
    auto bioptounop = TOKEN_BIOP_TO_UNOP.find(tok->getType());
    if (bioptounop == TOKEN_BIOP_TO_UNOP.end())
      return nullptr;

    type = std::get<1>(*bioptounop);
  }

  lexer.next(); // eat unary operator
  // ignore newline tekons
  while (*lexer.getCurrentToken() == TokenType::TOK_EOL)
    lexer.next();

  const Precedence prec = std::get<0>(OPERATORS_INFO.at(type));
  std::unique_ptr<Expr> expr = parseExpression(prec);
  if (!expr)
    return nullptr;

  return std::make_unique<UnOpExpr>(lexer,
    tok->getPosition() + expr->getPosition(), tok, std::move(expr));
}